

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O0

void ylt::metric::detail::process_status(void)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  element_type *peVar4;
  shared_ptr<_IO_FILE> stream_file;
  ProcStat stat;
  nullptr_t in_stack_fffffffffffffd28;
  undefined1 *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_static_counter<long> *this;
  string *in_stack_fffffffffffffd50;
  static_metric_manager<ylt::metric::ylt_system_tag_t> *in_stack_fffffffffffffd58;
  allocator<char> *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  __shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  undefined1 local_1a8 [4];
  undefined1 local_1a4 [4];
  undefined1 local_1a0 [4];
  undefined1 local_19c [4];
  undefined1 local_198 [4];
  undefined1 local_194 [147];
  allocator<char> local_101 [40];
  allocator<char> local_d9 [40];
  allocator<char> local_b1 [40];
  allocator<char> local_89 [40];
  allocator<char> local_61 [49];
  
  if ((process_status()::process_uptime == '\0') &&
     (iVar2 = __cxa_guard_acquire(&process_status()::process_uptime), iVar2 != 0)) {
    static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_counter<long>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(in_stack_fffffffffffffd30);
    std::allocator<char>::~allocator(local_61);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_counter<long>_>::~shared_ptr,
                 &process_status::process_uptime,&__dso_handle);
    __cxa_guard_release(&process_status()::process_uptime);
  }
  if ((process_status()::process_priority == '\0') &&
     (iVar2 = __cxa_guard_acquire(&process_status()::process_priority), iVar2 != 0)) {
    static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(in_stack_fffffffffffffd30);
    std::allocator<char>::~allocator(local_89);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &process_status::process_priority,&__dso_handle);
    __cxa_guard_release(&process_status()::process_priority);
  }
  if ((process_status()::pid == '\0') &&
     (iVar2 = __cxa_guard_acquire(&process_status()::pid), iVar2 != 0)) {
    static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(in_stack_fffffffffffffd30);
    std::allocator<char>::~allocator(local_b1);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &process_status::pid,&__dso_handle);
    __cxa_guard_release(&process_status()::pid);
  }
  if ((process_status()::ppid == '\0') &&
     (iVar2 = __cxa_guard_acquire(&process_status()::ppid), iVar2 != 0)) {
    static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(in_stack_fffffffffffffd30);
    std::allocator<char>::~allocator(local_d9);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &process_status::ppid,&__dso_handle);
    __cxa_guard_release(&process_status()::ppid);
  }
  if ((process_status()::pgrp == '\0') &&
     (iVar2 = __cxa_guard_acquire(&process_status()::pgrp), iVar2 != 0)) {
    static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(in_stack_fffffffffffffd30);
    std::allocator<char>::~allocator(local_101);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &process_status::pgrp,&__dso_handle);
    __cxa_guard_release(&process_status()::pgrp);
  }
  if ((process_status()::thread_count == '\0') &&
     (iVar2 = __cxa_guard_acquire(&process_status()::thread_count), iVar2 != 0)) {
    static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(in_stack_fffffffffffffd30);
    std::allocator<char>::~allocator((allocator<char> *)(local_194 + 0x6b));
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &process_status::thread_count,&__dso_handle);
    __cxa_guard_release(&process_status()::thread_count);
  }
  memset(local_1a8,0,0x78);
  pFVar3 = fopen("/proc/self/stat","r");
  std::shared_ptr<_IO_FILE>::
  shared_ptr<_IO_FILE,ylt::metric::detail::process_status()::_lambda(_IO_FILE*)_1_,void>
            ((shared_ptr<_IO_FILE> *)&local_1b8,pFVar3);
  bVar1 = std::operator==((shared_ptr<_IO_FILE> *)in_stack_fffffffffffffd30,
                          in_stack_fffffffffffffd28);
  if (!bVar1) {
    peVar4 = std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::get(&local_1b8);
    val = local_198;
    this = (basic_static_counter<long> *)local_194;
    iVar2 = __isoc99_fscanf(peVar4,
                            "%d %*s %c %d %d %d %d %d %u %lu %lu %lu %lu %lu %lu %lu %lu %ld %ld %ld"
                            ,local_1a8,local_1a4,local_1a0,local_19c);
    if (iVar2 == 0x13) {
      std::
      __shared_ptr_access<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x274ed3);
      basic_static_counter<long>::inc(this,(long)val);
      std::
      __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x274eee);
      basic_static_counter<long>::update(this,(long)val);
      std::
      __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x274f0c);
      basic_static_counter<long>::update(this,(long)val);
      std::
      __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x274f2a);
      basic_static_counter<long>::update(this,(long)val);
      std::
      __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x274f48);
      basic_static_counter<long>::update(this,(long)val);
      std::
      __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x274f66);
      basic_static_counter<long>::update(this,(long)val);
    }
  }
  std::shared_ptr<_IO_FILE>::~shared_ptr((shared_ptr<_IO_FILE> *)0x274f90);
  return;
}

Assistant:

inline void process_status() {
  static auto process_uptime =
      system_metric_manager::instance().get_metric_static<counter_t>(
          "ylt_process_uptime");
  static auto process_priority =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_priority");
  static auto pid =
      system_metric_manager::instance().get_metric_static<gauge_t>("ylt_pid");
  static auto ppid =
      system_metric_manager::instance().get_metric_static<gauge_t>("ylt_ppid");
  static auto pgrp =
      system_metric_manager::instance().get_metric_static<gauge_t>("ylt_pgrp");
  static auto thread_count =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_thread_count");

  ProcStat stat{};
#if defined(__linux__)
  auto stream_file =
      std::shared_ptr<FILE>(fopen("/proc/self/stat", "r"), [](FILE* ptr) {
        fclose(ptr);
      });
  if (stream_file == nullptr) {
    return;
  }

  if (fscanf(stream_file.get(),
             "%d %*s %c "
             "%d %d %d %d %d "
             "%u %lu %lu %lu "
             "%lu %lu %lu %lu %lu "
             "%ld %ld %ld",
             &stat.pid, &stat.state, &stat.ppid, &stat.pgrp, &stat.session,
             &stat.tty_nr, &stat.tpgid, &stat.flags, &stat.minflt,
             &stat.cminflt, &stat.majflt, &stat.cmajflt, &stat.utime,
             &stat.stime, &stat.cutime, &stat.cstime, &stat.priority,
             &stat.nice, &stat.num_threads) != 19) {
    return;
  }
#elif defined(__APPLE__)
  static pid_t proc_id = getpid();
  std::ostringstream oss;
  char cmdbuf[128];
  snprintf(cmdbuf, sizeof(cmdbuf),
           "ps -p %ld -o pid,ppid,pgid,sess"
           ",tpgid,flags,pri,nice | tail -n1",
           (long)proc_id);
  if (read_command_output_through_popen(oss, cmdbuf) != 0) {
    return;
  }
  const std::string &result = oss.str();
  if (sscanf(result.c_str(),
             "%d %d %d %d"
             "%d %u %ld %ld",
             &stat.pid, &stat.ppid, &stat.pgrp, &stat.session, &stat.tpgid,
             &stat.flags, &stat.priority, &stat.nice) != 8) {
    return;
  }
#endif
  process_uptime->inc();
  process_priority->update(stat.priority);
  pid->update(stat.pid);
  ppid->update(stat.ppid);
  pgrp->update(stat.pgrp);
  thread_count->update(stat.num_threads);
}